

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(int button,bool repeat)

{
  float *pfVar1;
  float fVar2;
  float y;
  ImGuiContext *pIVar3;
  float fVar4;
  float fVar5;
  bool local_2d;
  float rate;
  float delay;
  float t;
  ImGuiContext *g;
  bool repeat_local;
  int button_local;
  
  pIVar3 = GImGui;
  local_2d = 4 < (uint)button;
  if (local_2d) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x124e,"bool ImGui::IsMouseClicked(int, bool)");
  }
  fVar5 = (GImGui->IO).MouseDownDuration[button];
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    if ((repeat) && (pfVar1 = &(GImGui->IO).KeyRepeatDelay, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
      fVar2 = (GImGui->IO).KeyRepeatDelay;
      y = (GImGui->IO).KeyRepeatRate;
      fVar4 = ImFmod(fVar5 - fVar2,y);
      fVar5 = ImFmod((fVar5 - fVar2) - (pIVar3->IO).DeltaTime,y);
      if (y * 0.5 < fVar4 != y * 0.5 < fVar5) {
        return true;
      }
    }
    repeat_local = false;
  }
  else {
    repeat_local = true;
  }
  return repeat_local;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        float delay = g.IO.KeyRepeatDelay, rate = g.IO.KeyRepeatRate;
        if ((ImFmod(t - delay, rate) > rate*0.5f) != (ImFmod(t - delay - g.IO.DeltaTime, rate) > rate*0.5f))
            return true;
    }

    return false;
}